

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O3

ExpEmit __thiscall FxBoolCast::Emit(FxBoolCast *this,VMFunctionBuilder *build)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  byte bVar5;
  uint opa;
  
  uVar1 = (*this->basex->_vptr_FxExpression[7])();
  if ((uVar1 >> 0x10 & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1d1,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
  if (((iVar2 != 0) &&
      (iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 != 1)) &&
     (iVar2 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar2 != 3)) {
    __assert_fail("basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1d2,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  uVar3 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  bVar5 = (byte)(uVar1 >> 8);
  if (bVar5 < 4 && (uVar1 & 0x20000) == 0) {
    VMFunctionBuilder::RegAvailability::Return(build->Registers + (uVar1 >> 8 & 3),uVar1 & 0xff,1);
  }
  opa = uVar3 & 0xff;
  VMFunctionBuilder::Emit(build,1,opa,0);
  if (bVar5 == 3) {
    uVar4 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\0');
    iVar2 = 0xb4;
  }
  else {
    uVar4 = uVar1 >> 8 & 0xff;
    if (uVar4 == 1) {
      uVar4 = VMFunctionBuilder::GetConstantFloat(build,0.0);
      iVar2 = 0x98;
    }
    else {
      if (uVar4 != 0) goto LAB_0068da1f;
      iVar2 = 0x73;
      uVar4 = opa;
    }
  }
  VMFunctionBuilder::Emit(build,iVar2,1,uVar1 & 0xff,uVar4);
LAB_0068da1f:
  VMFunctionBuilder::Emit(build,0x37,1);
  VMFunctionBuilder::Emit(build,1,opa,1);
  return (ExpEmit)((uint3)uVar3 & 0xff);
}

Assistant:

ExpEmit FxBoolCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER);
	ExpEmit to(build, REGT_INT);
	from.Free(build);

	// Preload result with 0.
	build->Emit(OP_LI, to.RegNum, 0);

	// Check source against 0.
	if (from.RegType == REGT_INT)
	{
		build->Emit(OP_EQ_R, 1, from.RegNum, to.RegNum);
	}
	else if (from.RegType == REGT_FLOAT)
	{
		build->Emit(OP_EQF_K, 1, from.RegNum, build->GetConstantFloat(0.));
	}
	else if (from.RegType == REGT_POINTER)
	{
		build->Emit(OP_EQA_K, 1, from.RegNum, build->GetConstantAddress(nullptr, ATAG_GENERIC));
	}
	build->Emit(OP_JMP, 1);

	// Reload result with 1 if the comparison fell through.
	build->Emit(OP_LI, to.RegNum, 1);

	return to;
}